

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

bool google::protobuf::compiler::ruby::GenerateBinaryDescriptor
               (FileDescriptor *file,Printer *printer,string *error)

{
  io::Printer::Print<>
            (printer,"descriptor_data = File.binread(__FILE__).split(\"\\n__END__\\n\", 2)[1]");
  io::Printer::Print<>
            (printer,
             "\nGoogle::Protobuf::DescriptorPool.generated_pool.add_serialized_file(descriptor_data)\n\n"
            );
  return true;
}

Assistant:

bool GenerateBinaryDescriptor(const FileDescriptor* file, io::Printer* printer,
                              std::string* error) {
  printer->Print(
      R"(descriptor_data = File.binread(__FILE__).split("\n__END__\n", 2)[1])");
  printer->Print(
      "\nGoogle::Protobuf::DescriptorPool.generated_pool.add_serialized_file("
      "descriptor_data)\n\n");
  return true;
}